

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

PropertyIndex __thiscall
Js::SimpleTypeHandler<3UL>::GetPropertyIndex
          (SimpleTypeHandler<3UL> *this,PropertyRecord *propertyRecord)

{
  PropertyId propertyId;
  BOOL BVar1;
  ushort local_22;
  PropertyRecord *pPStack_20;
  PropertyIndex index;
  PropertyRecord *propertyRecord_local;
  SimpleTypeHandler<3UL> *this_local;
  
  pPStack_20 = propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  propertyId = PropertyRecord::GetPropertyId(propertyRecord);
  BVar1 = GetDescriptor(this,propertyId,&local_22);
  if ((BVar1 == 0) || ((this->descriptors[local_22].field_1.Attributes & 8) != 0)) {
    this_local._6_2_ = 0xffff;
  }
  else {
    this_local._6_2_ = local_22;
  }
  return this_local._6_2_;
}

Assistant:

PropertyIndex SimpleTypeHandler<size>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            return (PropertyIndex)index;
        }
        return Constants::NoSlot;
    }